

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O2

void __thiscall deqp::sl::ShaderParser::parseError(ShaderParser *this,string *errorStr)

{
  InternalError *this_00;
  allocator<char> local_d9;
  string atStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  atStr._M_dataplus._M_p = (pointer)&atStr.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&atStr,this->m_curPtr,this->m_curPtr + 0x50);
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Parser error: ",&local_d9)
  ;
  std::operator+(&local_98,&local_b8,errorStr);
  std::operator+(&local_78,&local_98," near \'");
  std::operator+(&local_58,&local_78,&atStr);
  std::operator+(&local_38,&local_58," ...\'");
  tcu::InternalError::InternalError
            (this_00,local_38._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibrary.cpp"
             ,0xce);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderParser::parseError(const std::string& errorStr)
{
	string atStr = string(m_curPtr, 80);
	throw tcu::InternalError((string("Parser error: ") + errorStr + " near '" + atStr + " ...'").c_str(), "", __FILE__,
							 __LINE__);
}